

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

Var Js::JavascriptDate::EntryToLocaleDateString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  EngineInterfaceObject *this;
  JavascriptFunction *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptDate *pJVar7;
  EngineExtensionObjectBase *pEVar8;
  JavascriptLibrary *pJVar9;
  JavascriptLibrary *extraout_RAX;
  JavascriptString *pJVar10;
  ScriptContext *pSVar11;
  ThreadContext *pTVar12;
  int in_stack_00000010;
  Arguments local_68;
  Arguments local_58;
  JavascriptLibrary *local_48;
  Var result;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar11 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar11->threadContext,0xc00,pSVar11,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x528,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc9590;
    *puVar5 = 0;
  }
  pSVar11 = (ScriptContext *)&result;
  callInfo_local = (CallInfo)result;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)pSVar11);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    pSVar11 = (ScriptContext *)0x52b;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x52b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bc9590;
    *puVar5 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
LAB_00bc9498:
    local_48 = (JavascriptLibrary *)0x0;
    BVar4 = TryInvokeRemotely(EntryToLocaleDateString,pSVar11,(Arguments *)&callInfo_local,&local_48
                             );
    if (BVar4 != 0) {
      return local_48;
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.toLocaleDateString");
  }
  pSVar11 = (ScriptContext *)0x0;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar3 = VarIs<Js::JavascriptDate>(pvVar6);
  if (!bVar3) goto LAB_00bc9498;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  pJVar7 = VarTo<Js::JavascriptDate>(pvVar6);
  if ((DAT_015b01f0 == '\x01') && (bVar3 = ScriptContext::IsIntlEnabled(scriptContext), bVar3)) {
    pJVar9 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    this = (pJVar9->super_JavascriptLibraryBase).engineInterfaceObject.ptr;
    bVar3 = true;
    if (this != (EngineInterfaceObject *)0x0) {
      pEVar8 = EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
      pJVar1 = *(JavascriptFunction **)&pEVar8[1].extensionKind;
      if (pJVar1 == (JavascriptFunction *)0x0) {
        JavascriptLibrary::InitializeIntlForDatePrototype
                  ((scriptContext->super_ScriptContextBase).javascriptLibrary);
        pJVar1 = *(JavascriptFunction **)&pEVar8[1].extensionKind;
        pJVar9 = extraout_RAX;
        if (pJVar1 == (JavascriptFunction *)0x0) goto LAB_00bc950b;
        pTVar12 = scriptContext->threadContext;
        bVar3 = pTVar12->reentrancySafeOrHandled;
        pTVar12->reentrancySafeOrHandled = true;
        local_58.Info = callInfo_local;
        local_58.Values = (Type)&stack0x00000018;
        pJVar9 = (JavascriptLibrary *)JavascriptFunction::CallFunction(pJVar1,&local_58);
      }
      else {
        pTVar12 = scriptContext->threadContext;
        bVar3 = pTVar12->reentrancySafeOrHandled;
        pTVar12->reentrancySafeOrHandled = true;
        local_68.Info = callInfo_local;
        local_68.Values = (Type)&stack0x00000018;
        pJVar9 = (JavascriptLibrary *)JavascriptFunction::CallFunction(pJVar1,&local_68);
      }
      pTVar12->reentrancySafeOrHandled = bVar3;
      bVar3 = false;
    }
LAB_00bc950b:
    if (!bVar3) {
      return pJVar9;
    }
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x558,"(args.Info.Count > 0)","Negative argument count");
    if (!bVar3) {
LAB_00bc9590:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pJVar10 = DateImplementation::GetString
                      (&pJVar7->m_date,(DateStringFormat)0x1,scriptContext,(DateTimeFlag)0x1);
  return pJVar10;
}

Assistant:

Var JavascriptDate::EntryToLocaleDateString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryToLocaleDateString, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.toLocaleDateString"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

#ifdef ENABLE_INTL_OBJECT
        if (CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled()){

            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* extensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));
                JavascriptFunction* func = extensionObject->GetDateToLocaleDateString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                // Initialize Date.prototype.toLocaleDateString
                scriptContext->GetLibrary()->InitializeIntlForDatePrototype();
                func = extensionObject->GetDateToLocaleDateString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return func->CallFunction(args);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        AssertMsg(args.Info.Count > 0, "Negative argument count");
        return date->m_date.GetString(
            DateImplementation::DateStringFormat::Locale, scriptContext,
            DateImplementation::DateTimeFlag::NoTime);
    }